

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuasispeciesEdgeCalculator.cpp
# Opt level: O0

void __thiscall
QuasispeciesEdgeCalculator::computeOffsets
          (QuasispeciesEdgeCalculator *this,int s1,int s2,int e1,int e2,int *offset1,int *offset2,
          int *overlap)

{
  int x_l2;
  int x_l1;
  int *offset1_local;
  int e2_local;
  int e1_local;
  int s2_local;
  int s1_local;
  QuasispeciesEdgeCalculator *this_local;
  
  if ((s1 == s2) && (e1 == e2)) {
    *overlap = e1 - s1;
    *offset1 = 0;
    *offset2 = 0;
  }
  else if (s1 == s2) {
    if (e1 < e2) {
      *overlap = e1 - s1;
    }
    else {
      *overlap = e2 - s2;
    }
    *offset1 = 0;
    *offset2 = 0;
  }
  else if (e1 == e2) {
    if (s2 < s1) {
      *overlap = e1 - s1;
      *offset1 = 0;
      *offset2 = (e2 - s2) - *overlap;
    }
    else {
      *overlap = e2 - s2;
      *offset1 = (e1 - s1) - *overlap;
      *offset2 = 0;
    }
  }
  else if (e1 < e2) {
    if (s1 < s2) {
      *overlap = e1 - s2;
      *offset1 = (e1 - s1) - *overlap;
      *offset2 = 0;
    }
    else {
      *overlap = e1 - s1;
      *offset1 = 0;
      *offset2 = (e1 - *overlap) - s2;
    }
  }
  else if (s2 < s1) {
    *overlap = e2 - s1;
    *offset1 = 0;
    *offset2 = (e2 - s2) - *overlap;
  }
  else {
    *overlap = e2 - s2;
    *offset1 = (e2 - *overlap) - s1;
    *offset2 = 0;
  }
  return;
}

Assistant:

void QuasispeciesEdgeCalculator::computeOffsets(int s1, int s2, int e1, int e2, int &offset1, int &offset2, int &overlap) const {
    int x_l1 = e1 - s1;
    int x_l2 = e2 - s2;
    if (s1 == s2 && e1 == e2) {
            // -----
            // -----
        overlap = e1 - s1;
        offset1 = 0;
        offset2 = 0;
    } else if (s1 == s2) {
            // ----  AND -----
            // ----- AND ----
        if (e1 < e2) {
            overlap = e1 - s1;
        } else {
            overlap = e2 - s2;
        }
        offset1 = 0;
        offset2 = 0;
    } else if (e1 == e2) {
            //  ---- AND -----
            // ----- AND  ----
        if (s1 > s2) {
            overlap = e1 - s1;
            offset1 = 0;
            offset2 = x_l2 - overlap;
        } else {
            overlap = e2 - s2;
            offset1 = x_l1 - overlap;
            offset2 = 0;
        }
    } else if (e1 < e2) {
            // ----    AND   --
            //   ----  AND ------
        if (s1 < s2) {
                // ----
                //   ----
            overlap = e1 - s2;
            offset1 = x_l1 - overlap;
            offset2 = 0;
        } else {
                //   --
                // ------
            overlap = e1 - s1;
            offset1 = 0;
            offset2 = e2 - (e2 - e1) - overlap - s2;
        }
    } else {
            //   ---- AND ------
            // ----   AND   --
        if (s2 < s1) {
                //   ----
                // ----
                //cout << "#########" << endl;
            overlap = e2 - s1;
            offset1 = 0;
            offset2 = x_l2 - overlap;
        } else {
                // ------
                //   --
            overlap = e2 - s2;
            offset1 = e1 - (e1 - e2) - overlap - s1;
            offset2 = 0;
        }
    }
}